

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanFlowEnd(Scanner *this)

{
  bool bVar1;
  undefined8 uVar2;
  reference pvVar3;
  Mark *mark_;
  Stream *in_RDI;
  Mark MVar4;
  TYPE type;
  FLOW_MARKER flowType;
  char ch;
  Mark mark;
  value_type *in_stack_fffffffffffffe28;
  Stream *__x;
  Stream *in_stack_fffffffffffffe30;
  Token *this_00;
  Mark *in_stack_fffffffffffffe38;
  TYPE type_;
  Scanner *in_stack_fffffffffffffe40;
  allocator *this_01;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  Token local_180;
  int local_128;
  undefined1 local_122;
  allocator local_121;
  string local_120 [32];
  value_type local_100;
  char local_f9;
  Mark local_f8;
  undefined8 local_e4;
  int local_dc;
  Mark local_d8;
  undefined8 local_c8;
  int local_c0;
  undefined1 local_5a;
  allocator local_59;
  string local_58 [32];
  Mark local_38;
  Mark local_18;
  
  bVar1 = InBlockContext((Scanner *)0xf1fea1);
  if (bVar1) {
    local_5a = 1;
    uVar2 = __cxa_allocate_exception(0x40);
    local_38 = YAML::Stream::mark(in_RDI);
    local_18 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"illegal flow end",&local_59);
    ParserException::ParserException
              ((ParserException *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               (string *)in_stack_fffffffffffffe30);
    local_5a = 0;
    __cxa_throw(uVar2,&ParserException::typeinfo,ParserException::~ParserException);
  }
  bVar1 = InFlowContext((Scanner *)0xf1fff9);
  type_ = (TYPE)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  if (bVar1) {
    pvVar3 = std::
             stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
             ::top((stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
                    *)0xf20013);
    if ((*pvVar3 == FLOW_MAP) &&
       (bVar1 = VerifySimpleKey((Scanner *)
                                CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
       bVar1)) {
      MVar4 = YAML::Stream::mark(in_RDI);
      local_d8.column = MVar4.column;
      local_c0 = local_d8.column;
      local_d8._0_8_ = MVar4._0_8_;
      local_c8._0_4_ = local_d8.pos;
      local_c8._4_4_ = local_d8.line;
      local_d8 = MVar4;
      Token::Token((Token *)in_stack_fffffffffffffe40,type_,(Mark *)in_stack_fffffffffffffe30);
      std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
                ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      Token::~Token((Token *)in_stack_fffffffffffffe30);
    }
    else {
      pvVar3 = std::
               stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
               ::top((stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
                      *)0xf200e8);
      if (*pvVar3 == FLOW_SEQ) {
        InvalidateSimpleKey(in_stack_fffffffffffffe40);
      }
    }
  }
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a = 0;
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3b = 1;
  MVar4 = YAML::Stream::mark(in_RDI);
  local_f8._0_8_ = MVar4._0_8_;
  local_e4._0_4_ = local_f8.pos;
  local_e4._4_4_ = local_f8.line;
  local_f8.column = MVar4.column;
  local_dc = local_f8.column;
  local_f8 = MVar4;
  local_f9 = YAML::Stream::get(in_stack_fffffffffffffe30);
  local_100 = (value_type)(local_f9 == ']');
  pvVar3 = std::
           stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
           ::top((stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
                  *)0xf2017e);
  if (*pvVar3 != local_100) {
    local_122 = 1;
    mark_ = (Mark *)__cxa_allocate_exception(0x40);
    this_01 = &local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"illegal flow end",this_01);
    ParserException::ParserException
              ((ParserException *)this_01,mark_,(string *)in_stack_fffffffffffffe30);
    local_122 = 0;
    __cxa_throw(mark_,&ParserException::typeinfo,ParserException::~ParserException);
  }
  std::
  stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
  ::pop((stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
         *)0xf20282);
  local_128 = (local_100 == FLOW_MAP) + 10;
  __x = in_RDI + 1;
  this_00 = &local_180;
  Token::Token((Token *)in_stack_fffffffffffffe40,type_,(Mark *)this_00);
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)this_00,
             (value_type *)__x);
  Token::~Token(this_00);
  return;
}

Assistant:

void Scanner::ScanFlowEnd() {
  if (InBlockContext())
    throw ParserException(INPUT.mark(), ErrorMsg::FLOW_END);

  // we might have a solo entry in the flow context
  if (InFlowContext()) {
    if (m_flows.top() == FLOW_MAP && VerifySimpleKey())
      m_tokens.push(Token(Token::VALUE, INPUT.mark()));
    else if (m_flows.top() == FLOW_SEQ)
      InvalidateSimpleKey();
  }

  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = true;

  // eat
  Mark mark = INPUT.mark();
  char ch = INPUT.get();

  // check that it matches the start
  FLOW_MARKER flowType = (ch == Keys::FlowSeqEnd ? FLOW_SEQ : FLOW_MAP);
  if (m_flows.top() != flowType)
    throw ParserException(mark, ErrorMsg::FLOW_END);
  m_flows.pop();

  Token::TYPE type = (flowType ? Token::FLOW_SEQ_END : Token::FLOW_MAP_END);
  m_tokens.push(Token(type, mark));
}